

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O3

QDebug operator<<(QDebug dbg,QCborArray *a)

{
  long lVar1;
  QCborContainerPrivate *this;
  DataPointer *pDVar2;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  char *pcVar3;
  QString *this_00;
  Stream *this_01;
  QCborContainerPrivate *pQVar4;
  long idx;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  undefined1 local_68 [16];
  QDebugStateSaver local_58;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)a);
  pQVar4 = (a->d).d.ptr;
  *(undefined1 *)&(pQVar4->elements).d.ptr = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QCborArray{";
  QString::fromUtf8((QString *)&local_50,(QString *)0xb,ba);
  QTextStream::operator<<((QTextStream *)pQVar4,(QString *)&local_50);
  if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
    }
  }
  pQVar4 = (a->d).d.ptr;
  if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
  }
  pQVar4 = (QCborContainerPrivate *)*in_RDX;
  if ((pQVar4 != (QCborContainerPrivate *)0x0) && (lVar1 = (pQVar4->elements).d.size, lVar1 != 0)) {
    pcVar3 = "";
    idx = 0;
    do {
      this = (a->d).d.ptr;
      this_00 = (QString *)0xffffffffffffffff;
      do {
        pDVar2 = &this_00->d;
        this_00 = (QString *)((long)&(this_00->d).d + 1);
      } while ((pcVar3 + 1)[(long)&pDVar2->d] != '\0');
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)pcVar3;
      QString::fromUtf8((QString *)&local_50,this_00,ba_00);
      QTextStream::operator<<((QTextStream *)this,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      this_01 = (Stream *)(a->d).d.ptr;
      if (this_01->space == true) {
        QTextStream::operator<<((QTextStream *)this_01,' ');
        this_01 = (Stream *)(a->d).d.ptr;
      }
      *(int *)&(((QList<QtCbor::Element> *)&this_01->ref)->d).d =
           *(int *)&(((QList<QtCbor::Element> *)&this_01->ref)->d).d + 1;
      local_68._0_8_ = this_01;
      QCborContainerPrivate::valueAt(&local_50,pQVar4,idx);
      operator<<((Stream *)(local_68 + 8),(QCborValue *)local_68);
      QDebug::~QDebug((QDebug *)(local_68 + 8));
      if (local_50.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_50.container);
      }
      QDebug::~QDebug((QDebug *)local_68);
      idx = idx + 1;
      pcVar3 = ", ";
    } while (idx != lVar1);
  }
  QTextStream::operator<<((QTextStream *)(a->d).d.ptr,'}');
  pQVar4 = (a->d).d.ptr;
  if (*(char *)&(pQVar4->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar4,' ');
    pQVar4 = (a->d).d.ptr;
  }
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar4;
  *(int *)&(pQVar4->elements).d.d = *(int *)&(pQVar4->elements).d.d + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborArray &a)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborArray{";
    const char *comma = "";
    for (auto v : a) {
        dbg << comma << v;
        comma = ", ";
    }
    return dbg << '}';
}